

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama.cpp
# Opt level: O2

int32_t llama_chat_apply_template
                  (char *tmpl,llama_chat_message *chat,size_t n_msg,bool add_ass,char *buf,
                  int32_t length)

{
  llm_chat_template tmpl_00;
  int32_t iVar1;
  size_t i;
  size_t sVar2;
  char *__s;
  vector<const_llama_chat_message_*,_std::allocator<const_llama_chat_message_*>_> chat_vec;
  string formatted_chat;
  string curr_tmpl;
  
  __s = "chatml";
  if (tmpl != (char *)0x0) {
    __s = tmpl;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&curr_tmpl,__s,(allocator<char> *)&formatted_chat);
  chat_vec.
  super__Vector_base<const_llama_chat_message_*,_std::allocator<const_llama_chat_message_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  chat_vec.
  super__Vector_base<const_llama_chat_message_*,_std::allocator<const_llama_chat_message_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  chat_vec.
  super__Vector_base<const_llama_chat_message_*,_std::allocator<const_llama_chat_message_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<const_llama_chat_message_*,_std::allocator<const_llama_chat_message_*>_>::resize
            (&chat_vec,n_msg);
  for (sVar2 = 0; n_msg != sVar2; sVar2 = sVar2 + 1) {
    chat_vec.
    super__Vector_base<const_llama_chat_message_*,_std::allocator<const_llama_chat_message_*>_>.
    _M_impl.super__Vector_impl_data._M_start[sVar2] = chat;
    chat = chat + 1;
  }
  formatted_chat._M_dataplus._M_p = (pointer)&formatted_chat.field_2;
  formatted_chat._M_string_length = 0;
  formatted_chat.field_2._M_local_buf[0] = '\0';
  tmpl_00 = llm_chat_detect_template(&curr_tmpl);
  if (tmpl_00 == LLM_CHAT_TEMPLATE_UNKNOWN) {
    iVar1 = -1;
  }
  else {
    iVar1 = llm_chat_apply_template(tmpl_00,&chat_vec,&formatted_chat,add_ass);
    if ((-1 < iVar1) && (0 < length && buf != (char *)0x0)) {
      strncpy(buf,formatted_chat._M_dataplus._M_p,(ulong)(uint)length);
    }
  }
  std::__cxx11::string::~string((string *)&formatted_chat);
  std::_Vector_base<const_llama_chat_message_*,_std::allocator<const_llama_chat_message_*>_>::
  ~_Vector_base(&chat_vec.
                 super__Vector_base<const_llama_chat_message_*,_std::allocator<const_llama_chat_message_*>_>
               );
  std::__cxx11::string::~string((string *)&curr_tmpl);
  return iVar1;
}

Assistant:

int32_t llama_chat_apply_template(
                              const char * tmpl,
         const struct llama_chat_message * chat,
                                  size_t   n_msg,
                                    bool   add_ass,
                                    char * buf,
                                 int32_t   length) {
    const std::string curr_tmpl(tmpl == nullptr ? "chatml" : tmpl);

    // format the chat to string
    std::vector<const llama_chat_message *> chat_vec;
    chat_vec.resize(n_msg);
    for (size_t i = 0; i < n_msg; i++) {
        chat_vec[i] = &chat[i];
    }

    std::string formatted_chat;
    llm_chat_template detected_tmpl = llm_chat_detect_template(curr_tmpl);
    if (detected_tmpl == LLM_CHAT_TEMPLATE_UNKNOWN) {
        return -1;
    }
    int32_t res = llm_chat_apply_template(detected_tmpl, chat_vec, formatted_chat, add_ass);
    if (res < 0) {
        return res;
    }
    if (buf && length > 0) {
        strncpy(buf, formatted_chat.c_str(), length);
    }
    return res;
}